

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O1

PipelineCreateInfo * __thiscall
vkt::Draw::PipelineCreateInfo::addState
          (PipelineCreateInfo *this,VkPipelineViewportStateCreateInfo *state)

{
  pointer pVVar1;
  void *pvVar2;
  VkViewport *pVVar3;
  VkRect2D *pVVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  VkStructureType VVar8;
  undefined4 uVar9;
  allocator_type local_31;
  void *local_30 [2];
  long local_20;
  
  std::vector<vk::VkViewport,std::allocator<vk::VkViewport>>::vector<vk::VkViewport_const*,void>
            ((vector<vk::VkViewport,std::allocator<vk::VkViewport>> *)local_30,state->pViewports,
             state->pViewports + state->viewportCount,&local_31);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::_M_move_assign
            (&this->m_viewports,(vector<vk::VkViewport,std::allocator<vk::VkViewport>> *)local_30);
  if (local_30[0] != (void *)0x0) {
    operator_delete(local_30[0],local_20 - (long)local_30[0]);
  }
  std::vector<vk::VkRect2D,std::allocator<vk::VkRect2D>>::vector<vk::VkRect2D_const*,void>
            ((vector<vk::VkRect2D,std::allocator<vk::VkRect2D>> *)local_30,state->pScissors,
             state->pScissors + state->scissorCount,(allocator_type *)&local_31);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::_M_move_assign
            (&this->m_scissors,(vector<vk::VkRect2D,std::allocator<vk::VkRect2D>> *)local_30);
  if (local_30[0] != (void *)0x0) {
    operator_delete(local_30[0],local_20 - (long)local_30[0]);
  }
  VVar8 = state->sType;
  uVar9 = *(undefined4 *)&state->field_0x4;
  pvVar2 = state->pNext;
  dVar5 = state->viewportCount;
  pVVar3 = state->pViewports;
  dVar6 = state->scissorCount;
  uVar7 = *(undefined4 *)&state->field_0x24;
  pVVar4 = state->pScissors;
  (this->m_viewportState).flags = state->flags;
  (this->m_viewportState).viewportCount = dVar5;
  (this->m_viewportState).pViewports = pVVar3;
  (this->m_viewportState).scissorCount = dVar6;
  *(undefined4 *)&(this->m_viewportState).field_0x24 = uVar7;
  (this->m_viewportState).pScissors = pVVar4;
  (this->m_viewportState).sType = VVar8;
  *(undefined4 *)&(this->m_viewportState).field_0x4 = uVar9;
  (this->m_viewportState).pNext = pvVar2;
  pVVar1 = (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->m_viewportState).pViewports =
       (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->m_viewportState).pScissors = pVVar1;
  (this->super_VkGraphicsPipelineCreateInfo).pViewportState = &this->m_viewportState;
  return this;
}

Assistant:

PipelineCreateInfo& PipelineCreateInfo::addState (const vk::VkPipelineViewportStateCreateInfo& state)
{
	m_viewports					= std::vector<vk::VkViewport>(state.pViewports, state.pViewports + state.viewportCount);
	m_scissors					= std::vector<vk::VkRect2D>(state.pScissors, state.pScissors + state.scissorCount);
	m_viewportState				= state;
	m_viewportState.pViewports	= &m_viewports[0];
	m_viewportState.pScissors	= &m_scissors[0];
	pViewportState				= &m_viewportState;

	return *this;
}